

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

_Bool IoTHubClientCore_LL_MessageCallback(IOTHUB_MESSAGE_HANDLE messageHandle,void *ctx)

{
  char cVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  time_t tVar4;
  _Bool _Var5;
  char *pcVar6;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *clientHandleData;
  
  if (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 || ctx == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return false;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_MessageCallback",0x2e0,1,
              "invalid argument: ctx(%p), messageHandle(%p)",ctx,messageHandle);
    return false;
  }
  tVar4 = get_time((time_t *)0x0);
  *(time_t *)((long)ctx + 0x158) = tVar4;
  iVar2 = *(int *)((long)ctx + 0x100);
  if (iVar2 == 3) {
    cVar1 = (**(code **)((long)ctx + 0x110))(messageHandle,*(undefined8 *)((long)ctx + 0x118));
    if (cVar1 != '\0') {
      return (_Bool)cVar1;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return false;
    }
    pcVar6 = "messageCallbackEx failed";
    iVar2 = 0x1f0;
    _Var5 = false;
  }
  else if (iVar2 == 2) {
    iVar2 = (**(code **)((long)ctx + 0x108))(messageHandle,*(undefined8 *)((long)ctx + 0x118));
    _Var5 = true;
    if (iVar2 == 3) {
      return true;
    }
    iVar2 = (**(code **)((long)ctx + 0x48))(*(undefined8 *)((long)ctx + 0x40),messageHandle,iVar2);
    if (iVar2 == 0) {
      return true;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return true;
    }
    pcVar6 = "IoTHubTransport_SendMessageDisposition failed";
    iVar2 = 0x1e4;
  }
  else if (iVar2 == 1) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return false;
    }
    pcVar6 = "Invalid workflow - not currently set up to accept messages";
    _Var5 = false;
    iVar2 = 0x1d8;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return false;
    }
    pcVar6 = "Invalid state";
    _Var5 = false;
    iVar2 = 0x1f6;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"invoke_message_callback",iVar2,1,pcVar6);
  return _Var5;
}

Assistant:

static bool IoTHubClientCore_LL_MessageCallback(IOTHUB_MESSAGE_HANDLE messageHandle, void* ctx)
{
    bool result;
    if ((ctx == NULL) || messageHandle == NULL)
    {
        LogError("invalid argument: ctx(%p), messageHandle(%p)", ctx, messageHandle);
        result = false;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* clientHandleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        return invoke_message_callback(clientHandleData, messageHandle);
    }
    return result;
}